

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O3

gravity_closure_t * gravity_class_lookup_closure(gravity_class_t *c,gravity_value_t key)

{
  gravity_object_t *pgVar1;
  gravity_value_t *pgVar2;
  
  if (c != (gravity_class_t *)0x0) {
    do {
      pgVar2 = gravity_hash_lookup(c->htable,key);
      if (pgVar2 != (gravity_value_t *)0x0) {
        pgVar1 = (pgVar2->field_1).p;
        if (pgVar1 == (gravity_object_t *)0x0) {
          return (gravity_closure_t *)0x0;
        }
        if (pgVar1->isa != gravity_class_closure) {
          return (gravity_closure_t *)0x0;
        }
        return (gravity_closure_t *)pgVar1;
      }
      c = c->superclass;
    } while (c != (gravity_class_s *)0x0);
  }
  return (gravity_closure_t *)0x0;
}

Assistant:

inline gravity_object_t *gravity_class_lookup (gravity_class_t *c, gravity_value_t key) {
    while (c) {
        gravity_value_t *v = gravity_hash_lookup(c->htable, key);
        if (v) return (gravity_object_t *)v->p;
        c = c->superclass;
    }
    return NULL;
}